

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef.c
# Opt level: O0

void cdef_fb_col(AV1_COMMON *cm,MACROBLOCKD *xd,CdefBlockInfo *fb_info,uint16_t **colbuf,
                int *cdef_left,int fbc,int fbr)

{
  byte bVar1;
  int iVar2;
  int plane_00;
  int iVar3;
  CdefBlockInfo *in_RCX;
  int iVar4;
  long in_RDX;
  AV1_COMMON *in_RDI;
  void *in_R8;
  int in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_0000000c;
  uint16_t **in_stack_00000010;
  int plane;
  CdefInfo *cdef_info;
  int sec_strength [2];
  int level [2];
  int is_zero_level [2];
  int num_planes;
  int mbmi_cdef_strength;
  CommonModeInfoParams *mi_params;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  undefined2 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9a;
  undefined1 uVar5;
  CdefInfo *level_00;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  undefined8 local_48;
  CommonModeInfoParams *pCVar6;
  undefined4 in_stack_ffffffffffffffd0;
  
  pCVar6 = &in_RDI->mi_params;
  iVar2 = (int)(char)((short)(*(short *)&(in_RDI->mi_params).mi_grid_base
                                         [in_stack_00000008 * 0x10 * (in_RDI->mi_params).mi_stride +
                                          in_R9D * 0x10]->field_0xa7 << 1) >> 0xc);
  plane_00 = av1_num_planes(in_RDI);
  local_48 = 0x100000001;
  memset(&stack0xffffffffffffffb0,0,8);
  memset(&stack0xffffffffffffffa8,0,8);
  level_00 = &in_RDI->cdef_info;
  if ((pCVar6->mi_grid_base[in_stack_00000008 * 0x10 * pCVar6->mi_stride + in_R9D * 0x10] ==
       (MB_MODE_INFO *)0x0) || (iVar2 == -1)) {
    memset(in_R8,0,(long)plane_00 << 2);
  }
  else {
    iVar3 = (in_RDI->cdef_info).cdef_strengths[iVar2] / 4;
    iVar4 = (in_RDI->cdef_info).cdef_strengths[iVar2] % 4;
    iVar4 = (uint)(iVar4 == 3) + iVar4;
    uVar5 = iVar3 == 0 && iVar4 == 0;
    local_48 = CONCAT44(local_48._4_4_,(uint)(byte)uVar5);
    if (1 < plane_00) {
      in_stack_ffffffffffffffb4 = (in_RDI->cdef_info).cdef_uv_strengths[iVar2] / 4;
      in_stack_ffffffffffffffac = (in_RDI->cdef_info).cdef_uv_strengths[iVar2] % 4;
      in_stack_ffffffffffffffac = (uint)(in_stack_ffffffffffffffac == 3) + in_stack_ffffffffffffffac
      ;
      in_stack_ffffffffffffff9a = in_stack_ffffffffffffffb4 == 0 && in_stack_ffffffffffffffac == 0;
      local_48 = (ulong)CONCAT14(in_stack_ffffffffffffff9a,(uint)(byte)uVar5);
    }
    if (((int)local_48 == 0) || (local_48._4_4_ == 0)) {
      iVar2 = av1_cdef_compute_sb_list
                        ((CommonModeInfoParams *)in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                         (cdef_list *)CONCAT44(in_R9D,in_stack_ffffffffffffffd0),
                         (BLOCK_SIZE)((ulong)pCVar6 >> 0x38));
      *(int *)(in_RDX + 0x270) = iVar2;
      if (*(int *)(in_RDX + 0x270) == 0) {
        memset(in_R8,0,(long)plane_00 << 2);
      }
      else {
        for (iVar2 = 0; iVar2 < plane_00; iVar2 = iVar2 + 1) {
          if ((iVar2 == 0) ||
             (bVar1 = get_plane_type(iVar2), *(int *)((long)&local_48 + (ulong)bVar1 * 4) == 0)) {
            cdef_init_fb_col((MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffb4,iVar3),
                             (CdefBlockInfo *)CONCAT44(in_stack_ffffffffffffffac,iVar4),
                             (int *)level_00,
                             (int *)CONCAT44(iVar2,CONCAT13(uVar5,CONCAT12(in_stack_ffffffffffffff9a
                                                                           ,
                                                  in_stack_ffffffffffffff98))),
                             in_stack_ffffffffffffff94,in_stack_ffffffffffffff90,plane_00);
            cdef_prepare_fb((AV1_COMMON *)sec_strength,(CdefBlockInfo *)cdef_info,in_stack_00000010,
                            in_stack_0000000c,in_stack_00000008,unaff_retaddr,is_zero_level[0]);
            cdef_filter_fb(in_RCX,(int)((ulong)in_R8 >> 0x20),(uint8_t)((ulong)in_R8 >> 0x18));
            *(undefined4 *)((long)in_R8 + (long)iVar2 * 4) = 1;
          }
          else {
            *(undefined4 *)((long)in_R8 + (long)iVar2 * 4) = 0;
          }
        }
      }
    }
    else {
      memset(in_R8,0,(long)plane_00 << 2);
    }
  }
  return;
}

Assistant:

static void cdef_fb_col(const AV1_COMMON *const cm, const MACROBLOCKD *const xd,
                        CdefBlockInfo *const fb_info, uint16_t **const colbuf,
                        int *cdef_left, int fbc, int fbr) {
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mbmi_cdef_strength =
      mi_params
          ->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                         MI_SIZE_64X64 * fbc]
          ->cdef_strength;
  const int num_planes = av1_num_planes(cm);
  int is_zero_level[PLANE_TYPES] = { 1, 1 };
  int level[PLANE_TYPES] = { 0 };
  int sec_strength[PLANE_TYPES] = { 0 };
  const CdefInfo *const cdef_info = &cm->cdef_info;

  if (mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc] == NULL ||
      mbmi_cdef_strength == -1) {
    av1_zero_array(cdef_left, num_planes);
    return;
  }

  // Compute level and secondary strength for planes
  level[PLANE_TYPE_Y] =
      cdef_info->cdef_strengths[mbmi_cdef_strength] / CDEF_SEC_STRENGTHS;
  sec_strength[PLANE_TYPE_Y] =
      cdef_info->cdef_strengths[mbmi_cdef_strength] % CDEF_SEC_STRENGTHS;
  sec_strength[PLANE_TYPE_Y] += sec_strength[PLANE_TYPE_Y] == 3;
  is_zero_level[PLANE_TYPE_Y] =
      (level[PLANE_TYPE_Y] == 0) && (sec_strength[PLANE_TYPE_Y] == 0);

  if (num_planes > 1) {
    level[PLANE_TYPE_UV] =
        cdef_info->cdef_uv_strengths[mbmi_cdef_strength] / CDEF_SEC_STRENGTHS;
    sec_strength[PLANE_TYPE_UV] =
        cdef_info->cdef_uv_strengths[mbmi_cdef_strength] % CDEF_SEC_STRENGTHS;
    sec_strength[PLANE_TYPE_UV] += sec_strength[PLANE_TYPE_UV] == 3;
    is_zero_level[PLANE_TYPE_UV] =
        (level[PLANE_TYPE_UV] == 0) && (sec_strength[PLANE_TYPE_UV] == 0);
  }

  if (is_zero_level[PLANE_TYPE_Y] && is_zero_level[PLANE_TYPE_UV]) {
    av1_zero_array(cdef_left, num_planes);
    return;
  }

  fb_info->cdef_count = av1_cdef_compute_sb_list(mi_params, fbr * MI_SIZE_64X64,
                                                 fbc * MI_SIZE_64X64,
                                                 fb_info->dlist, BLOCK_64X64);
  if (!fb_info->cdef_count) {
    av1_zero_array(cdef_left, num_planes);
    return;
  }

  for (int plane = 0; plane < num_planes; plane++) {
    // Do not skip cdef filtering for luma plane as filter direction is
    // computed based on luma.
    if (plane && is_zero_level[get_plane_type(plane)]) {
      cdef_left[plane] = 0;
      continue;
    }
    cdef_init_fb_col(xd, fb_info, level, sec_strength, fbc, fbr, plane);
    cdef_prepare_fb(cm, fb_info, colbuf, cdef_left[plane], fbc, fbr, plane);
    cdef_filter_fb(fb_info, plane, cm->seq_params->use_highbitdepth);
    cdef_left[plane] = 1;
  }
}